

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_lxvw4x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 val;
  TCGv_i64 val_00;
  TCGv_i64 EA_00;
  TCGv_i64 val_01;
  TCGv_i64 ret;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i64 xtl;
  TCGv_i64 xth;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    val = tcg_temp_new_i64(tcg_ctx_00);
    val_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_set_access_type(ctx,0x20);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    if ((ctx->le_mode & 1U) == 0) {
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val,EA_00,(long)ctx->mem_idx,MO_BEQ);
      tcg_gen_addi_i64_ppc64(tcg_ctx_00,EA_00,EA_00,8);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_00,EA_00,(long)ctx->mem_idx,MO_BEQ);
    }
    else {
      val_01 = tcg_temp_new_i64(tcg_ctx_00);
      ret = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_01,EA_00,(long)ctx->mem_idx,MO_64);
      tcg_gen_shri_i64_ppc64(tcg_ctx_00,ret,val_01,0x20);
      tcg_gen_deposit_i64_ppc64(tcg_ctx_00,val,ret,val_01,0x20,0x20);
      tcg_gen_addi_i64_ppc64(tcg_ctx_00,EA_00,EA_00,8);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_01,EA_00,(long)ctx->mem_idx,MO_64);
      tcg_gen_shri_i64_ppc64(tcg_ctx_00,ret,val_01,0x20);
      tcg_gen_deposit_i64_ppc64(tcg_ctx_00,val_00,ret,val_01,0x20,0x20);
      tcg_temp_free_i64(tcg_ctx_00,val_01);
      tcg_temp_free_i64(tcg_ctx_00,ret);
    }
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1,val);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrl(tcg_ctx_00,uVar1,val_00);
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,val);
    tcg_temp_free_i64(tcg_ctx_00,val_00);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_lxvw4x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);

    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);

    gen_addr_reg_index(ctx, EA);
    if (ctx->le_mode) {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, ctx->mem_idx, MO_LEQ);
        tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
        tcg_gen_deposit_i64(tcg_ctx, xth, t1, t0, 32, 32);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, ctx->mem_idx, MO_LEQ);
        tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
        tcg_gen_deposit_i64(tcg_ctx, xtl, t1, t0, 32, 32);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    } else {
        tcg_gen_qemu_ld_i64(tcg_ctx, xth, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, xtl, EA, ctx->mem_idx, MO_BEQ);
    }
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
}